

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# denialofservice_tests.cpp
# Opt level: O0

void denialofservice_tests::outbound_slow_chain_eviction_invoker(void)

{
  basic_wrap_stringstream<char> *line_num;
  basic_wrap_stringstream<char> *msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  long in_FS_OFFSET;
  outbound_slow_chain_eviction t;
  basic_wrap_stringstream<char> *in_stack_fffffffffffff178;
  std_string *in_stack_fffffffffffff180;
  basic_wrap_stringstream<char> *in_stack_fffffffffffff188;
  outbound_slow_chain_eviction *in_stack_fffffffffffff198;
  const_string *in_stack_fffffffffffff1a0;
  size_t in_stack_fffffffffffff1a8;
  const_string *in_stack_fffffffffffff1b0;
  const_string *file;
  unit_test_log_t *in_stack_fffffffffffff1b8;
  unit_test_log_t *this_00;
  const_string local_c88;
  outbound_slow_chain_eviction *in_stack_fffffffffffff388;
  undefined1 local_af0 [408];
  undefined1 local_958 [408];
  undefined1 local_7c0 [1568];
  undefined1 local_1a0 [408];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff188,
             (pointer)in_stack_fffffffffffff180,(unsigned_long)in_stack_fffffffffffff178);
  memset(local_1a0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff178);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff178);
  boost::operator<<(in_stack_fffffffffffff188,(char *)in_stack_fffffffffffff180);
  boost::operator<<(in_stack_fffffffffffff188,(char (*) [29])in_stack_fffffffffffff180);
  boost::operator<<(in_stack_fffffffffffff188,(char (*) [15])in_stack_fffffffffffff180);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff188);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff188,in_stack_fffffffffffff180);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0,in_stack_fffffffffffff1a8,
             in_stack_fffffffffffff1a0);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff178);
  outbound_slow_chain_eviction::outbound_slow_chain_eviction(in_stack_fffffffffffff198);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff188,
             (pointer)in_stack_fffffffffffff180,(unsigned_long)in_stack_fffffffffffff178);
  memset(local_7c0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff178);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff178);
  boost::operator<<(in_stack_fffffffffffff188,(char *)in_stack_fffffffffffff180);
  boost::operator<<(in_stack_fffffffffffff188,(char (*) [29])in_stack_fffffffffffff180);
  boost::operator<<(in_stack_fffffffffffff188,(char (*) [16])in_stack_fffffffffffff180);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff188);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff188,in_stack_fffffffffffff180);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0,in_stack_fffffffffffff1a8,
             in_stack_fffffffffffff1a0);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff178);
  boost::unit_test::setup_conditional<denialofservice_tests::outbound_slow_chain_eviction>
            ((outbound_slow_chain_eviction *)0x5b8bbe);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff188,
             (pointer)in_stack_fffffffffffff180,(unsigned_long)in_stack_fffffffffffff178);
  memset(local_958,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff178);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff178);
  boost::operator<<(in_stack_fffffffffffff188,(char *)in_stack_fffffffffffff180);
  boost::operator<<(in_stack_fffffffffffff188,(char (*) [29])in_stack_fffffffffffff180);
  boost::operator<<(in_stack_fffffffffffff188,(char (*) [13])in_stack_fffffffffffff180);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff188);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff188,in_stack_fffffffffffff180);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0,in_stack_fffffffffffff1a8,
             in_stack_fffffffffffff1a0);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff178);
  outbound_slow_chain_eviction::test_method(in_stack_fffffffffffff388);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff188,
             (pointer)in_stack_fffffffffffff180,(unsigned_long)in_stack_fffffffffffff178);
  memset(local_af0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff178);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff178);
  boost::operator<<(in_stack_fffffffffffff188,(char *)in_stack_fffffffffffff180);
  boost::operator<<(in_stack_fffffffffffff188,(char (*) [29])in_stack_fffffffffffff180);
  boost::operator<<(in_stack_fffffffffffff188,(char (*) [19])in_stack_fffffffffffff180);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff188);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff188,in_stack_fffffffffffff180);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0,in_stack_fffffffffffff1a8,
             in_stack_fffffffffffff1a0);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff178);
  boost::unit_test::teardown_conditional<denialofservice_tests::outbound_slow_chain_eviction>
            ((outbound_slow_chain_eviction *)0x5b8e0e);
  this_00 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff188,
             (pointer)in_stack_fffffffffffff180,(unsigned_long)in_stack_fffffffffffff178);
  file = &local_c88;
  memset(file,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff178);
  line_num = boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff178);
  msg = boost::operator<<(in_stack_fffffffffffff188,(char *)in_stack_fffffffffffff180);
  boost::operator<<(in_stack_fffffffffffff188,(char (*) [29])in_stack_fffffffffffff180);
  boost::operator<<(in_stack_fffffffffffff188,(char (*) [15])in_stack_fffffffffffff180);
  this = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff188);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)this,in_stack_fffffffffffff180);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (this_00,file,(size_t)line_num,(const_string *)msg);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff178);
  outbound_slow_chain_eviction::~outbound_slow_chain_eviction
            ((outbound_slow_chain_eviction *)in_stack_fffffffffffff178);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(outbound_slow_chain_eviction)
{
    LOCK(NetEventsInterface::g_msgproc_mutex);

    ConnmanTestMsg& connman = static_cast<ConnmanTestMsg&>(*m_node.connman);
    // Disable inactivity checks for this test to avoid interference
    connman.SetPeerConnectTimeout(99999s);
    PeerManager& peerman = *m_node.peerman;

    // Mock an outbound peer
    CAddress addr1(ip(0xa0b0c001), NODE_NONE);
    NodeId id{0};
    CNode dummyNode1{id++,
                     /*sock=*/nullptr,
                     addr1,
                     /*nKeyedNetGroupIn=*/0,
                     /*nLocalHostNonceIn=*/0,
                     CAddress(),
                     /*addrNameIn=*/"",
                     ConnectionType::OUTBOUND_FULL_RELAY,
                     /*inbound_onion=*/false};

    connman.Handshake(
        /*node=*/dummyNode1,
        /*successfully_connected=*/true,
        /*remote_services=*/ServiceFlags(NODE_NETWORK | NODE_WITNESS),
        /*local_services=*/ServiceFlags(NODE_NETWORK | NODE_WITNESS),
        /*version=*/PROTOCOL_VERSION,
        /*relay_txs=*/true);

    // This test requires that we have a chain with non-zero work.
    {
        LOCK(cs_main);
        BOOST_CHECK(m_node.chainman->ActiveChain().Tip() != nullptr);
        BOOST_CHECK(m_node.chainman->ActiveChain().Tip()->nChainWork > 0);
    }

    // Test starts here
    BOOST_CHECK(peerman.SendMessages(&dummyNode1)); // should result in getheaders

    {
        LOCK(dummyNode1.cs_vSend);
        const auto& [to_send, _more, _msg_type] = dummyNode1.m_transport->GetBytesToSend(false);
        BOOST_CHECK(!to_send.empty());
    }
    connman.FlushSendBuffer(dummyNode1);

    int64_t nStartTime = GetTime();
    // Wait 21 minutes
    SetMockTime(nStartTime+21*60);
    BOOST_CHECK(peerman.SendMessages(&dummyNode1)); // should result in getheaders
    {
        LOCK(dummyNode1.cs_vSend);
        const auto& [to_send, _more, _msg_type] = dummyNode1.m_transport->GetBytesToSend(false);
        BOOST_CHECK(!to_send.empty());
    }
    // Wait 3 more minutes
    SetMockTime(nStartTime+24*60);
    BOOST_CHECK(peerman.SendMessages(&dummyNode1)); // should result in disconnect
    BOOST_CHECK(dummyNode1.fDisconnect == true);

    peerman.FinalizeNode(dummyNode1);
}